

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O0

void __thiscall QTapTestLogger::endYamlish(QTapTestLogger *this)

{
  bool bVar1;
  char *in_RDI;
  QAbstractTestLogger *unaff_retaddr;
  char *msg;
  
  msg = in_RDI;
  bVar1 = QTestCharBuffer::isEmpty((QTestCharBuffer *)(in_RDI + 0x430));
  if (!bVar1) {
    QAbstractTestLogger::outputString(unaff_retaddr,msg);
    QAbstractTestLogger::outputString(unaff_retaddr,msg);
    QTestCharBuffer::constData((QTestCharBuffer *)(in_RDI + 0x430));
    QAbstractTestLogger::outputString(unaff_retaddr,msg);
    QTestCharBuffer::clear((QTestCharBuffer *)(in_RDI + 0x430));
  }
  QAbstractTestLogger::outputString(unaff_retaddr,msg);
  return;
}

Assistant:

void QTapTestLogger::endYamlish()
{
    // Flush any accumulated messages:
    if (!m_messages.isEmpty()) {
        outputString(YAML_INDENT "extensions:\n");
        outputString(YAML_INDENT YAML_INDENT "messages:\n");
        outputString(m_messages.constData());
        m_messages.clear();
    }
    outputString(YAML_INDENT "...\n");
}